

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yprp_when(lys_ypr_ctx_conflict *pctx,lysp_when *when,int8_t *flag)

{
  uint16_t *puVar1;
  ulong uVar2;
  int8_t inner_flag;
  
  inner_flag = '\0';
  if (when != (lysp_when *)0x0) {
    ypr_close_parent(pctx,flag);
    uVar2 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar2 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*s<when condition=\"",uVar2,"");
    lyxml_dump_text((pctx->field_0).field_0.out,when->cond,'\x01');
    ly_print_((pctx->field_0).field_0.out,"\"");
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    yprp_extension_instances(pctx,LY_STMT_WHEN,'\0',when->exts,&inner_flag);
    ypr_description(pctx,when->dsc,when->exts,&inner_flag);
    ypr_reference(pctx,when->ref,when->exts,&inner_flag);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,"when",inner_flag);
  }
  return;
}

Assistant:

static void
yprp_when(struct lys_ypr_ctx *pctx, struct lysp_when *when, int8_t *flag)
{
    int8_t inner_flag = 0;

    if (!when) {
        return;
    }

    ypr_close_parent(pctx, flag);
    ly_print_(pctx->out, "%*s<when condition=\"", INDENT);
    lyxml_dump_text(pctx->out, when->cond, 1);
    ly_print_(pctx->out, "\"");

    LEVEL++;
    yprp_extension_instances(pctx, LY_STMT_WHEN, 0, when->exts, &inner_flag);
    ypr_description(pctx, when->dsc, when->exts, &inner_flag);
    ypr_reference(pctx, when->ref, when->exts, &inner_flag);
    LEVEL--;
    ypr_close(pctx, "when", inner_flag);
}